

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void __thiscall MD5Context::Init(MD5Context *this)

{
  MD5Context *this_local;
  
  this->buf[0] = 0x67452301;
  this->buf[1] = 0xefcdab89;
  this->buf[2] = 0x98badcfe;
  this->buf[3] = 0x10325476;
  this->bytes[0] = 0;
  this->bytes[1] = 0;
  return;
}

Assistant:

void MD5Context::Init()
{
	buf[0] = 0x67452301;
	buf[1] = 0xefcdab89;
	buf[2] = 0x98badcfe;
	buf[3] = 0x10325476;

	bytes[0] = 0;
	bytes[1] = 0;
}